

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_choices_validation_case_sensitive(void)

{
  cargo_t ctx;
  int iVar1;
  cargo_validation_t *vd;
  char *pcVar2;
  cargo_t cargo;
  char *str;
  char *args [3];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    str = (char *)0x0;
    iVar1 = cargo_add_option(cargo,0,"--alpha -a",(char *)0x0,"s");
    ctx = cargo;
    if (iVar1 == 0) {
      vd = cargo_validate_choices(CARGO_VALIDATE_CHOICES_CASE_SENSITIVE,CARGO_STRING,2,"abc","def");
      iVar1 = cargo_add_validation(ctx,CARGO_VALIDATION_NONE,"--alpha",vd);
      if (iVar1 == 0) {
        args[2] = "abc";
        args[0] = "program";
        args[1] = "--alpha";
        iVar1 = cargo_parse(cargo,0,1,3,args);
        pcVar2 = "Failed to parse";
        if (iVar1 == 0) {
          args[2] = "def";
          args[0] = "program";
          args[1] = "--alpha";
          iVar1 = cargo_parse(cargo,0,1,3,args);
          if (iVar1 == 0) {
            args[2] = "klmn";
            args[0] = "program";
            args[1] = "--alpha";
            iVar1 = cargo_parse(cargo,0,1,3,args);
            if (iVar1 < 0) {
              args[2] = "ABC";
              args[0] = "program";
              args[1] = "--alpha";
              iVar1 = cargo_parse(cargo,0,1,3,args);
              if (iVar1 < 0) {
                args[2] = "DEF";
                args[0] = "program";
                args[1] = "--alpha";
                pcVar2 = (char *)0x0;
                iVar1 = cargo_parse(cargo,0,1,3,args);
                if (-1 < iVar1) {
                  pcVar2 = "Expected parse failure for DEF";
                }
              }
              else {
                pcVar2 = "Expected parse failure for ABC";
              }
            }
            else {
              pcVar2 = "Expected parse failure for klmn";
            }
          }
        }
      }
      else {
        pcVar2 = "Failed to add validation";
      }
    }
    else {
      pcVar2 = "Failed to add option";
    }
    _cargo_xfree(&str);
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_choices_validation_case_sensitive)
{
    char *str = NULL;
    _CARGO_ADD_TEST_VALIDATE("s", &str,
            cargo_validate_choices,
            CARGO_VALIDATE_CHOICES_CASE_SENSITIVE,
            CARGO_STRING,
            2, "abc", "def");
    _CARGO_TEST_VALIDATE_VALUE(abc, 0);
    _CARGO_TEST_VALIDATE_VALUE(def, 0);
    _CARGO_TEST_VALIDATE_VALUE(klmn, 1);
    _CARGO_TEST_VALIDATE_VALUE(ABC, 1);
    _CARGO_TEST_VALIDATE_VALUE(DEF, 1);
    _TEST_CLEANUP();
    _cargo_xfree(&str);
}